

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer_unittest.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::TestLineCollector::ConsumeLine
          (TestLineCollector *this,string_view line,string *out_error)

{
  string *psVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  AlphaNum *in_R8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  local_d8._M_str = line._M_str;
  local_d8._M_len = line._M_len;
  psVar1 = this->reject_;
  if ((psVar1 == (string *)0x0) || (__n = psVar1->_M_string_length, __n != local_d8._M_len)) {
LAB_00a94a18:
    bVar3 = true;
    if ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->lines_ !=
        (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->lines_,
                 &local_d8);
    }
  }
  else {
    if (__n != 0) {
      iVar2 = bcmp((psVar1->_M_dataplus)._M_p,local_d8._M_str,__n);
      if (iVar2 != 0) goto LAB_00a94a18;
    }
    if (this->skip_msg_ == false) {
      local_48 = 10;
      local_40 = "Rejected \'";
      local_78.piece_._M_str = (psVar1->_M_dataplus)._M_p;
      local_78.piece_._M_len = psVar1->_M_string_length;
      local_a8.piece_._M_len = 1;
      local_a8.piece_._M_str = "\'";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_c8,(lts_20250127 *)&local_48,&local_78,&local_a8,in_R8);
      std::__cxx11::string::operator=((string *)out_error,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ConsumeLine(absl::string_view line, std::string* out_error) override {
    if (reject_ && *reject_ == line) {
      if (!skip_msg_) {
        *out_error = absl::StrCat("Rejected '", *reject_, "'");
      }
      return false;
    }
    if (lines_) {
      lines_->emplace_back(line);
    }
    return true;
  }